

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_half_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::ConvertToHalfPass::ProcessDefault(ConvertToHalfPass *this,Instruction *inst)

{
  pointer pOVar1;
  uint **ppuVar2;
  IRContext *this_00;
  bool bVar3;
  char cVar4;
  uint **ppuVar5;
  pointer pOVar6;
  bool modified;
  byte local_79;
  Instruction *local_78;
  long **local_70;
  undefined8 local_68;
  code *local_60;
  code *local_58;
  uint *local_50;
  long *local_48;
  undefined8 local_40;
  code *local_38;
  code *local_30;
  
  local_78 = inst;
  if (inst->opcode_ == OpPhi) {
    bVar3 = ProcessPhi(this,inst,0x10,0x20);
    return bVar3;
  }
  local_79 = 0;
  local_40 = 0;
  local_48 = (long *)operator_new(0x18);
  *local_48 = (long)&local_78;
  local_48[1] = (long)&local_79;
  local_48[2] = (long)this;
  local_30 = std::
             _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/convert_to_half_pass.cpp:281:21)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/convert_to_half_pass.cpp:281:21)>
             ::_M_manager;
  local_68 = 0;
  local_58 = std::
             _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:830:17)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:830:17)>
             ::_M_manager;
  pOVar6 = (inst->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pOVar1 = (inst->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_70 = &local_48;
  if (pOVar6 != pOVar1) {
    do {
      bVar3 = spvIsInIdType(pOVar6->type);
      if (bVar3) {
        ppuVar2 = (uint **)(pOVar6->words).large_data_._M_t.
                           super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           .
                           super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                           ._M_head_impl;
        ppuVar5 = &(pOVar6->words).small_data_;
        if (ppuVar2 != (uint **)0x0) {
          ppuVar5 = ppuVar2;
        }
        local_50 = *ppuVar5;
        if (local_60 == (code *)0x0) {
          std::__throw_bad_function_call();
        }
        cVar4 = (*local_58)(&local_70,&local_50);
        if (cVar4 == '\0') break;
      }
      pOVar6 = pOVar6 + 1;
    } while (pOVar6 != pOVar1);
    if (local_60 == (code *)0x0) goto LAB_005848ed;
  }
  (*local_60)(&local_70,&local_70,3);
LAB_005848ed:
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,3);
  }
  if (local_79 == 1) {
    this_00 = (this->super_Pass).context_;
    if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(this_00);
    }
    analysis::DefUseManager::AnalyzeInstUse
              ((this_00->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
               local_78);
  }
  else {
    local_79 = 0;
  }
  return (bool)(local_79 & 1);
}

Assistant:

bool ConvertToHalfPass::ProcessDefault(Instruction* inst) {
  // If non-relaxed instruction has changed operands, need to convert
  // them back to float32
  if (inst->opcode() == spv::Op::OpPhi) return ProcessPhi(inst, 16u, 32u);
  bool modified = false;
  inst->ForEachInId([&inst, &modified, this](uint32_t* idp) {
    if (converted_ids_.count(*idp) == 0) return;
    uint32_t old_id = *idp;
    GenConvert(idp, 32, inst);
    if (*idp != old_id) modified = true;
  });
  if (modified) get_def_use_mgr()->AnalyzeInstUse(inst);
  return modified;
}